

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

void poll_cb(uv_poll_t *handle,int status,int events)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  ssize_t sVar4;
  int *piVar5;
  long *plVar6;
  int64_t eval_b;
  int64_t eval_a;
  char buffer [5];
  int fd;
  long local_30;
  char local_24 [8];
  int local_1c;
  
  iVar1 = uv_fileno(handle,&local_1c);
  local_30 = (long)iVar1;
  if (local_30 == 0) {
    local_24[0] = '\0';
    local_24[1] = '\0';
    local_24[2] = '\0';
    local_24[3] = '\0';
    local_24[4] = 0;
    if ((events & 8U) != 0) {
      do {
        sVar4 = recv(client_fd,local_24,5,1);
        if ((int)sVar4 != -1) {
          if (-1 < (int)sVar4) goto LAB_001b543f;
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          break;
        }
        piVar5 = __errno_location();
        iVar1 = *piVar5;
      } while (iVar1 == 4);
      if (iVar1 != 0x16) {
LAB_001b543f:
        cli_pr_check = 1;
        iVar1 = uv_poll_stop(poll_req);
        local_30 = (long)iVar1;
        if (local_30 != 0) goto LAB_001b5791;
        iVar1 = uv_poll_start(poll_req,3,poll_cb);
        local_30 = (long)iVar1;
        if (local_30 == 0) goto LAB_001b54a6;
        goto LAB_001b579e;
      }
      goto LAB_001b57b8;
    }
LAB_001b54a6:
    if ((events & 1U) == 0) goto LAB_001b572c;
    if (local_1c != client_fd) goto LAB_001b5675;
    do {
      sVar4 = recv(client_fd,local_24,5,0);
      iVar1 = (int)sVar4;
      if (iVar1 != -1) {
        if (-1 < iVar1) goto LAB_001b5505;
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar2 = *piVar5;
    } while (iVar2 == 4);
    if (iVar2 == 0x16) goto LAB_001b57d7;
LAB_001b5505:
    if (cli_rd_check != 0) {
      if (cli_rd_check != 1) {
LAB_001b5675:
        if (local_1c != server_fd) {
LAB_001b572c:
          if ((events & 2U) == 0) {
            return;
          }
          do {
            sVar4 = send(client_fd,"foo",3,0);
            if (-1 < (int)sVar4) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
          local_30 = 3;
          if ((int)sVar4 == 3) {
            return;
          }
          goto LAB_001b57ab;
        }
        do {
          sVar4 = recv(server_fd,local_24,3,0);
          iVar1 = (int)sVar4;
          if (iVar1 != -1) {
            if (-1 < iVar1) goto LAB_001b56cb;
            piVar5 = __errno_location();
            iVar2 = *piVar5;
            break;
          }
          piVar5 = __errno_location();
          iVar2 = *piVar5;
        } while (iVar2 == 4);
        if (iVar2 != 0x16) {
LAB_001b56cb:
          local_30 = 3;
          if (iVar1 != 3) goto LAB_001b57bd;
          iVar1 = strncmp(local_24,"foo",3);
          local_30 = (long)iVar1;
          if (local_30 == 0) {
            srv_rd_check = 1;
            uv_poll_stop(0x371160);
            goto LAB_001b572c;
          }
          goto LAB_001b57ca;
        }
        goto LAB_001b57dc;
      }
      iVar2 = strncmp(local_24,"world",(long)iVar1);
      local_30 = (long)iVar2;
      if (local_30 != 0) goto LAB_001b57e1;
      local_30 = 5;
      if ((long)iVar1 == 5) {
        cli_rd_check = 2;
        goto LAB_001b5675;
      }
      goto LAB_001b57fb;
    }
    local_30 = 4;
    if (iVar1 != 4) goto LAB_001b57ee;
    iVar1 = strncmp(local_24,"hello",4);
    local_30 = (long)iVar1;
    if (local_30 == 0) {
      cli_rd_check = 1;
      do {
        while( true ) {
          plVar6 = (long *)(ulong)(uint)server_fd;
          sVar4 = recv(server_fd,local_24,5,0);
          uVar3 = (uint)sVar4;
          if (uVar3 == 0xffffffff) break;
          if ((int)uVar3 < 1) {
            piVar5 = __errno_location();
            iVar1 = *piVar5;
            goto LAB_001b5667;
          }
          local_30 = 5;
          if ((uVar3 & 0x7fffffff) != 5) goto LAB_001b5815;
          iVar1 = strncmp(local_24,"world",5);
          local_30 = (long)iVar1;
          if (local_30 != 0) goto LAB_001b5822;
          cli_rd_check = 2;
        }
        piVar5 = __errno_location();
        iVar1 = *piVar5;
      } while (iVar1 == 4);
LAB_001b5667:
      if ((iVar1 != 0xb) && (iVar1 != 0x73)) goto LAB_001b582f;
      goto LAB_001b5675;
    }
  }
  else {
    poll_cb_cold_1();
LAB_001b5791:
    poll_cb_cold_2();
LAB_001b579e:
    poll_cb_cold_3();
LAB_001b57ab:
    poll_cb_cold_16();
LAB_001b57b8:
    poll_cb_cold_4();
LAB_001b57bd:
    poll_cb_cold_12();
LAB_001b57ca:
    poll_cb_cold_13();
LAB_001b57d7:
    poll_cb_cold_15();
LAB_001b57dc:
    poll_cb_cold_14();
LAB_001b57e1:
    poll_cb_cold_10();
LAB_001b57ee:
    poll_cb_cold_5();
LAB_001b57fb:
    poll_cb_cold_11();
  }
  poll_cb_cold_6();
LAB_001b5815:
  poll_cb_cold_7();
LAB_001b5822:
  plVar6 = &local_30;
  poll_cb_cold_8();
LAB_001b582f:
  poll_cb_cold_9();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(0x371160);
  uv_close(&server_handle,0);
  uv_close(&client_handle,0);
  uv_close(&peer_handle,0);
  uv_close(plVar6,0);
  return;
}

Assistant:

static void poll_cb(uv_poll_t* handle, int status, int events) {
  char buffer[5];
  int n;
  int fd;

  ASSERT_OK(uv_fileno((uv_handle_t*)handle, &fd));
  memset(buffer, 0, 5);

  if (events & UV_PRIORITIZED) {
    do
      n = recv(client_fd, &buffer, 5, MSG_OOB);
    while (n == -1 && errno == EINTR);
    ASSERT(n >= 0 || errno != EINVAL);
    cli_pr_check = 1;
    ASSERT_OK(uv_poll_stop(&poll_req[0]));
    ASSERT_OK(uv_poll_start(&poll_req[0],
                            UV_READABLE | UV_WRITABLE,
                            poll_cb));
  }
  if (events & UV_READABLE) {
    if (fd == client_fd) {
      do
        n = recv(client_fd, &buffer, 5, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      if (cli_rd_check == 1) {
        ASSERT_OK(strncmp(buffer, "world", n));
        ASSERT_EQ(5, n);
        cli_rd_check = 2;
      }
      if (cli_rd_check == 0) {
        ASSERT_EQ(4, n);
        ASSERT_OK(strncmp(buffer, "hello", n));
        cli_rd_check = 1;
        do {
          do
            n = recv(server_fd, &buffer, 5, 0);
          while (n == -1 && errno == EINTR);
          if (n > 0) {
            ASSERT_EQ(5, n);
            ASSERT_OK(strncmp(buffer, "world", n));
            cli_rd_check = 2;
          }
        } while (n > 0);

        ASSERT(got_eagain());
      }
    }
    if (fd == server_fd) {
      do
        n = recv(server_fd, &buffer, 3, 0);
      while (n == -1 && errno == EINTR);
      ASSERT(n >= 0 || errno != EINVAL);
      ASSERT_EQ(3, n);
      ASSERT_OK(strncmp(buffer, "foo", n));
      srv_rd_check = 1;
      uv_poll_stop(&poll_req[1]);
    }
  }
  if (events & UV_WRITABLE) {
    do {
      n = send(client_fd, "foo", 3, 0);
    } while (n < 0 && errno == EINTR);
    ASSERT_EQ(3, n);
  }
}